

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

int __thiscall
roaring::Roaring64Map::select
          (Roaring64Map *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  _Rb_tree_color _Var1;
  ulong uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  _Rb_tree_node_base *p_Var5;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  uint32_t low_bytes;
  uint32_t local_3c;
  fd_set *local_38;
  
  p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = __readfds;
  uVar2 = CONCAT44(in_register_00000034,__nfds);
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == &(this->roarings)._M_t._M_impl.super__Rb_tree_header) {
      return 0;
    }
    _Var1 = p_Var5[1]._M_color;
    uVar4 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var5[1]._M_parent);
    if (uVar2 < uVar4) break;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    uVar2 = uVar2 - uVar4;
  }
  _Var3 = roaring_bitmap_select((roaring_bitmap_t *)&p_Var5[1]._M_parent,(uint32_t)uVar2,&local_3c);
  if (_Var3) {
    local_38->fds_bits[0] = CONCAT44(_Var1,local_3c);
    return (int)CONCAT71((int7)((ulong)local_38 >> 8),1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Logic error: bitmap.select() returned false despite rank < cardinality()");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool select(uint64_t rank, uint64_t *element) const {
        for (const auto &map_entry : roarings) {
            auto key = map_entry.first;
            const auto &bitmap = map_entry.second;

            uint64_t sub_cardinality = bitmap.cardinality();
            if (rank < sub_cardinality) {
                uint32_t low_bytes;
                // Casting rank to uint32_t is safe because
                // rank < sub_cardinality and sub_cardinality <= 2^32.
                if (!bitmap.select((uint32_t)rank, &low_bytes)) {
                    ROARING_TERMINATE(
                        "Logic error: bitmap.select() "
                        "returned false despite rank < cardinality()");
                }
                *element = uniteBytes(key, low_bytes);
                return true;
            }
            rank -= sub_cardinality;
        }
        return false;
    }